

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O2

CURLcode canon_string(char *q,size_t len,dynbuf *dq,_Bool *found_equals)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  uint5 uVar4;
  char cVar5;
  CURLcode CVar6;
  uint uVar7;
  undefined8 in_RAX;
  char *mem;
  byte *pbVar8;
  size_t sStack_40;
  char out [3];
  undefined1 uStack_35;
  char tmp [3];
  undefined1 uStack_31;
  
  CVar6 = CURLE_OK;
  sVar2 = 1;
  _out = in_RAX;
  do {
    if ((len == 0) || (CVar6 != CURLE_OK)) {
      return CVar6;
    }
    bVar1 = *q;
    sStack_40 = sVar2;
    mem = q;
    pbVar8 = (byte *)q;
    if ((((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
       (bVar1 - 0x2d < 2)) {
LAB_00136c2f:
      CVar6 = Curl_dyn_addn(dq,mem,sStack_40);
    }
    else {
      if (bVar1 != 0x25) {
        if ((bVar1 != 0x7e) && (bVar1 != 0x5f)) {
          uVar4 = _uStack_35;
          _out = (ulong)_uStack_35 << 0x18;
          _out = CONCAT62(stack0xffffffffffffffca,0x25);
          bVar1 = *q;
          if (found_equals == (_Bool *)0x0) {
            if (bVar1 == 0x2f) goto LAB_00136c2f;
          }
          else if (bVar1 == 0x3d) {
            CVar6 = Curl_dyn_addn(dq,q,1);
            *found_equals = true;
            goto LAB_00136c34;
          }
          _out = CONCAT53(uVar4,(char  [3])
                                CONCAT12("0123456789ABCDEF"[(byte)*q & 0xf],
                                         (undefined2)CONCAT11("0123456789ABCDEF"[bVar1 >> 4],'%')));
          mem = out;
          goto LAB_00136d41;
        }
        goto LAB_00136c2f;
      }
      if (((9 < (byte)(((byte *)q)[1] - 0x30)) &&
          ((uVar7 = ((byte *)q)[1] - 0x41, 0x25 < uVar7 ||
           ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) == 0)))) ||
         ((9 < (byte)(((byte *)q)[2] - 0x30) &&
          ((uVar7 = ((byte *)q)[2] - 0x41, 0x25 < uVar7 ||
           ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) == 0)))))) {
        mem = "%25";
LAB_00136d41:
        sStack_40 = 3;
        goto LAB_00136c2f;
      }
      pbVar8 = (byte *)q + 2;
      uVar3 = _out >> 0x30;
      _out = CONCAT24(0x25,_out);
      _out = CONCAT26((short)uVar3,_out) & 0xff00ffffffffffff;
      cVar5 = Curl_raw_toupper(((byte *)q)[1]);
      _out = CONCAT15(cVar5,_out);
      cVar5 = Curl_raw_toupper(((byte *)q)[2]);
      _out = CONCAT16(cVar5,_out);
      CVar6 = Curl_dyn_addn(dq,tmp,3);
      len = len - 2;
    }
LAB_00136c34:
    q = (char *)(pbVar8 + 1);
    len = len - 1;
  } while( true );
}

Assistant:

static CURLcode canon_string(const char *q, size_t len,
                             struct dynbuf *dq, bool *found_equals)
{
  CURLcode result = CURLE_OK;

  for(; len && !result; q++, len--) {
    if(ISALNUM(*q))
      result = Curl_dyn_addn(dq, q, 1);
    else {
      switch(*q) {
      case '-':
      case '.':
      case '_':
      case '~':
        /* allowed as-is */
        result = Curl_dyn_addn(dq, q, 1);
        break;
      case '%':
        /* uppercase the following if hexadecimal */
        if(ISXDIGIT(q[1]) && ISXDIGIT(q[2])) {
          char tmp[3]="%";
          tmp[1] = Curl_raw_toupper(q[1]);
          tmp[2] = Curl_raw_toupper(q[2]);
          result = Curl_dyn_addn(dq, tmp, 3);
          q += 2;
          len -= 2;
        }
        else
          /* '%' without a following two-digit hex, encode it */
          result = Curl_dyn_addn(dq, "%25", 3);
        break;
      default: {
        const char hex[] = "0123456789ABCDEF";
        char out[3]={'%'};

        if(!found_equals) {
          /* if found_equals is NULL assuming, been in path */
          if(*q == '/') {
            /* allowed as if */
            result = Curl_dyn_addn(dq, q, 1);
            break;
          }
        }
        else {
          /* allowed as-is */
          if(*q == '=') {
            result = Curl_dyn_addn(dq, q, 1);
            *found_equals = TRUE;
            break;
          }
        }
        /* URL encode */
        out[1] = hex[((unsigned char)*q) >> 4];
        out[2] = hex[*q & 0xf];
        result = Curl_dyn_addn(dq, out, 3);
        break;
      }
      }
    }
  }
  return result;
}